

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.cpp
# Opt level: O0

status * diy::mpi::detail::probe(DIY_MPI_Comm comm,int source,int tag)

{
  MPI_Comm poVar1;
  MPI_Comm *ppoVar2;
  MPI_Status *pMVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  DIY_MPI_Status *in_RDI;
  status *s;
  DIY_MPI_Comm local_8;
  
  ppoVar2 = mpi_cast(&local_8);
  poVar1 = *ppoVar2;
  pMVar3 = mpi_cast(in_RDI);
  MPI_Probe(in_EDX,in_ECX,poVar1,pMVar3);
  return (status *)in_RDI;
}

Assistant:

status probe(DIY_MPI_Comm comm, int source, int tag)
{
#if DIY_HAS_MPI
  status s;
  MPI_Probe(source, tag, mpi_cast(comm), &mpi_cast(s.handle));
  return s;
#else
  (void) comm; (void) source; (void) tag;
  DIY_UNSUPPORTED_MPI_CALL(MPI_Probe);
#endif
}